

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O0

void __thiscall Engine::checkMemoryUsage(Engine *this)

{
  FILE *pFVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Clause **ppCVar5;
  vec<IntVar_*> *in_RDI;
  uint i_2;
  longlong clause_mem;
  uint i_1;
  longlong prop_mem;
  uint i;
  longlong var_mem;
  uint local_34;
  long local_30;
  uint local_24;
  long local_20;
  uint local_14;
  long local_10;
  
  pFVar1 = _stderr;
  uVar2 = vec<IntVar_*>::size(in_RDI);
  uVar3 = SAT::nVars((SAT *)0x27fb77);
  uVar4 = vec<Propagator_*>::size((vec<Propagator_*> *)(in_RDI + 2));
  fprintf(pFVar1,"%d int vars, %d sat vars, %d propagators\n",(ulong)uVar2,(ulong)uVar3,(ulong)uVar4
         );
  pFVar1 = _stderr;
  memUsed();
  fprintf(pFVar1,"%.2fMb memory usage\n");
  fprintf(_stderr,"Size of IntVars: %d %d %d\n",0x60,0x78,0xb0);
  fprintf(_stderr,"Size of Propagator: %d\n",0x18);
  local_10 = 0;
  local_14 = 0;
  while( true ) {
    uVar2 = vec<IntVar_*>::size(in_RDI);
    if (uVar2 <= local_14) break;
    local_10 = local_10 + 0xb0;
    local_14 = local_14 + 1;
  }
  fprintf(_stderr,"%lld bytes used by vars\n",local_10);
  local_20 = 0;
  local_24 = 0;
  while( true ) {
    uVar2 = vec<Propagator_*>::size((vec<Propagator_*> *)(in_RDI + 2));
    if (uVar2 <= local_24) break;
    local_20 = local_20 + 0x18;
    local_24 = local_24 + 1;
  }
  fprintf(_stderr,"%lld bytes used by propagators\n",local_20);
  local_30 = 0;
  local_34 = 0;
  while( true ) {
    uVar2 = vec<Clause_*>::size(&sat.clauses);
    if (uVar2 <= local_34) break;
    ppCVar5 = vec<Clause_*>::operator[](&sat.clauses,local_34);
    uVar2 = Clause::size(*ppCVar5);
    local_30 = (ulong)uVar2 * 4 + local_30;
    local_34 = local_34 + 1;
  }
  fprintf(_stderr,"%lld bytes used by sat clauses\n",local_30);
  return;
}

Assistant:

void Engine::checkMemoryUsage() {
	fprintf(stderr, "%d int vars, %d sat vars, %d propagators\n", vars.size(), sat.nVars(),
					propagators.size());
	fprintf(stderr, "%.2fMb memory usage\n", memUsed());

	fprintf(stderr, "Size of IntVars: %d %d %d\n", static_cast<int>(sizeof(IntVar)),
					static_cast<int>(sizeof(IntVarEL)), static_cast<int>(sizeof(IntVarLL)));
	fprintf(stderr, "Size of Propagator: %d\n", static_cast<int>(sizeof(Propagator)));

	long long var_mem = 0;
	for (unsigned int i = 0; i < vars.size(); i++) {
		var_mem += sizeof(IntVarLL);
		/*
				var_mem += vars[i]->sz;
				if (vars[i]->getType() == INT_VAR_LL) {
					var_mem += 24 * ((IntVarLL*) vars[i])->ld.size();
				}
		*/
	}
	fprintf(stderr, "%lld bytes used by vars\n", var_mem);

	long long prop_mem = 0;
	for (unsigned int i = 0; i < propagators.size(); i++) {
		prop_mem += sizeof(*propagators[i]);
	}
	fprintf(stderr, "%lld bytes used by propagators\n", prop_mem);
	/*
		long long var_range_sum = 0;
		for (int i = 0; i < vars.size(); i++) {
			var_range_sum += vars[i]->max - vars[i]->min;
		}
		fprintf(stderr, "%lld range sum in vars\n", var_range_sum);
	*/
	long long clause_mem = 0;
	for (unsigned int i = 0; i < sat.clauses.size(); i++) {
		clause_mem += sizeof(Lit) * sat.clauses[i]->size();
	}
	fprintf(stderr, "%lld bytes used by sat clauses\n", clause_mem);
	/*
		int constants, hundred, thousand, large;
		constants = hundred = thousand = large = 0;
		for (int i = 0; i < vars.size(); i++) {
			int sz = vars[i]->max - vars[i]->min;
			if (sz == 0) constants++;
			else if (sz <= 100) hundred++;
			else if (sz <= 1000) thousand++;
			else large++;
		}
		fprintf(stderr, "Int sizes: %d %d %d %d\n", constants, hundred, thousand, large);
	*/
}